

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O3

float Map_NodeReadRefPhaseEst(Map_Node_t *pNode,int fPhase)

{
  float *pfVar1;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Map_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                  ,0x41,"float Map_NodeReadRefPhaseEst(Map_Node_t *, int)");
  }
  if (pNode->pCutBest[0] == (Map_Cut_t *)0x0) {
    if (pNode->pCutBest[1] == (Map_Cut_t *)0x0) {
      __assert_fail("pNode->pCutBest[0] || pNode->pCutBest[1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                    ,0x44,"float Map_NodeReadRefPhaseEst(Map_Node_t *, int)");
    }
  }
  else if (pNode->pCutBest[1] != (Map_Cut_t *)0x0) {
    pfVar1 = pNode->nRefEst + fPhase;
    goto LAB_003ffb18;
  }
  pfVar1 = pNode->nRefEst + 2;
LAB_003ffb18:
  return *pfVar1;
}

Assistant:

float Map_NodeReadRefPhaseEst( Map_Node_t * pNode, int fPhase )
{
    assert( !Map_IsComplement(pNode) );
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] ) // both assigned
        return pNode->nRefEst[fPhase];
    assert( pNode->pCutBest[0] || pNode->pCutBest[1] ); // at least one assigned
//    return pNode->nRefEst[0] + pNode->nRefEst[1];
    return pNode->nRefEst[2];
}